

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::~WebSocketResponseImpl
          (WebSocketResponseImpl *this)

{
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&this->task);
  Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_>::dispose(&this->fulfiller);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

WebSocketResponseImpl(kj::Own<kj::PromiseFulfiller<HttpClient::WebSocketResponse>> fulfiller)
        : fulfiller(kj::mv(fulfiller)) {}